

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesImpl<false,true,true>
          (BeagleCPUImpl<float,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar4 = ZEXT816(0) << 0x40;
  uVar3 = 0;
  while ((~((int)*(uint *)(this + 0x14) >> 0x1f) & *(uint *)(this + 0x14)) != uVar3) {
    auVar4 = vcvtps2pd_avx(auVar4);
    auVar5._0_4_ = *(float *)(*(long *)(this + 0xf8) + uVar3 * 4) /
                   *(float *)(*(long *)(this + 0xf0) + uVar3 * 4);
    auVar5._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar5 = vinsertps_avx(ZEXT416((uint)(auVar5._0_4_ * auVar5._0_4_)),auVar5,0x10);
    auVar5 = vcvtps2pd_avx(auVar5);
    uVar1 = *(undefined8 *)(*(long *)(this + 0x78) + uVar3 * 8);
    auVar2._8_8_ = uVar1;
    auVar2._0_8_ = uVar1;
    auVar4 = vfmadd132pd_avx512vl(auVar5,auVar4,auVar2);
    uVar3 = uVar3 + 1;
    auVar4 = vcvtpd2ps_avx(auVar4);
  }
  auVar5 = vmovshdup_avx(auVar4);
  *outSumDerivatives = (double)auVar5._0_4_;
  *outSumSquaredDerivatives = (double)auVar4._0_4_;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}